

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeTableMoveto(BtCursor *pCur,i64 intKey,int biasRight,int *pRes)

{
  u8 uVar1;
  ushort uVar2;
  ushort uVar3;
  MemPage *pMVar4;
  u8 *puVar5;
  u8 *puVar6;
  long lVar7;
  int iVar8;
  u32 newPgno;
  ulong uVar9;
  u8 *p;
  int iVar10;
  u16 uVar11;
  int iVar12;
  uint local_48;
  i64 nCellKey;
  
  if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
    lVar7 = (pCur->info).nKey;
    if (lVar7 == intKey) {
      *pRes = 0;
      return 0;
    }
    if (lVar7 < intKey) {
      if ((pCur->curFlags & 8) != 0) goto LAB_0013efe2;
      if (lVar7 + 1 == intKey) {
        *pRes = 0;
        iVar8 = sqlite3BtreeNext(pCur,(int)intKey);
        if (iVar8 != 0x65) {
          if (iVar8 != 0) {
            return iVar8;
          }
          getCellInfo(pCur);
          if ((pCur->info).nKey == intKey) {
            return 0;
          }
        }
      }
    }
  }
  iVar8 = moveToRoot(pCur);
  if (iVar8 != 0x10) {
    if (iVar8 != 0) {
      return iVar8;
    }
LAB_0013ee41:
    pMVar4 = pCur->pPage;
    uVar2 = pMVar4->nCell;
    iVar10 = uVar2 - 1;
    iVar12 = iVar10 >> (1U - (char)biasRight & 0x1f);
    puVar5 = pMVar4->aDataOfst;
    uVar3 = pMVar4->maskPage;
    puVar6 = pMVar4->aCellIdx;
    uVar1 = pMVar4->intKeyLeaf;
    iVar8 = 0;
    do {
      p = puVar5 + (CONCAT11(puVar6[(long)iVar12 * 2],puVar6[(long)iVar12 * 2 + 1]) & uVar3);
      if (uVar1 != '\0') {
        while ((char)*p < '\0') {
          p = p + 1;
          if (pMVar4->aDataEnd <= p) {
            iVar8 = sqlite3CorruptError(0x12a35);
            return iVar8;
          }
        }
        p = p + 1;
      }
      sqlite3GetVarint(p,(u64 *)&nCellKey);
      uVar11 = (u16)iVar12;
      if (nCellKey < intKey) {
        iVar8 = iVar12 + 1;
        if (iVar10 <= iVar12) goto LAB_0013eef2;
      }
      else {
        if (nCellKey <= intKey) {
          pCur->ix = uVar11;
          if (pMVar4->leaf != '\0') {
            pCur->curFlags = pCur->curFlags | 2;
            (pCur->info).nKey = nCellKey;
            (pCur->info).nSize = 0;
            *pRes = 0;
            return 0;
          }
          goto LAB_0013ef29;
        }
        if (iVar12 <= iVar8) {
          iVar10 = 1;
          iVar12 = iVar8;
          goto LAB_0013ef1e;
        }
        iVar10 = iVar12 + -1;
      }
      iVar12 = iVar10 + iVar8 >> 1;
    } while( true );
  }
LAB_0013efe2:
  *pRes = -1;
  return 0;
LAB_0013eef2:
  iVar10 = -1;
  iVar12 = iVar8;
LAB_0013ef1e:
  if (pMVar4->leaf != '\0') {
    pCur->ix = uVar11;
    *pRes = iVar10;
    iVar8 = 0;
    goto LAB_0013f00a;
  }
LAB_0013ef29:
  local_48 = (uint)uVar2;
  if (iVar12 < (int)local_48) {
    uVar9 = (ulong)(uVar3 & CONCAT11(puVar6[(long)iVar12 * 2],puVar6[(long)iVar12 * 2 + 1]));
  }
  else {
    uVar9 = (ulong)pMVar4->hdrOffset + 8;
  }
  newPgno = sqlite3Get4byte(pMVar4->aData + uVar9);
  pCur->ix = (u16)iVar12;
  iVar8 = moveToChild(pCur,newPgno);
  if (iVar8 != 0) {
LAB_0013f00a:
    (pCur->info).nSize = 0;
    return iVar8;
  }
  goto LAB_0013ee41;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTableMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo==0 );
  assert( pCur->eState!=CURSOR_VALID || pCur->curIntKey!=0 );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0 ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        assert( cursorIsAtLastEntry(pCur) || CORRUPT_DB );
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowly. */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc!=SQLITE_DONE ){
          return rc;
        }
      }
    }
  }

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey );

  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    for(;;){
      i64 nCellKey;
      pCell = findCellPastPtr(pPage, idx);
      if( pPage->intKeyLeaf ){
        while( 0x80 <= *(pCell++) ){
          if( pCell>=pPage->aDataEnd ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
        }
      }
      getVarint(pCell, (u64*)&nCellKey);
      if( nCellKey<intKey ){
        lwr = idx+1;
        if( lwr>upr ){ c = -1; break; }
      }else if( nCellKey>intKey ){
        upr = idx-1;
        if( lwr>upr ){ c = +1; break; }
      }else{
        assert( nCellKey==intKey );
        pCur->ix = (u16)idx;
        if( !pPage->leaf ){
          lwr = idx;
          goto moveto_table_next_layer;
        }else{
          pCur->curFlags |= BTCF_ValidNKey;
          pCur->info.nKey = nCellKey;
          pCur->info.nSize = 0;
          *pRes = 0;
          return SQLITE_OK;
        }
      }
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
    }
    assert( lwr==upr+1 || !pPage->leaf );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_table_finish;
    }
moveto_table_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_table_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}